

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

void make_engr_at(level *lev,int x,int y,char *s,long e_time,xchar e_type)

{
  char cVar1;
  engr **ppeVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  engr *peVar6;
  char *pcVar7;
  engr *peVar8;
  size_t __n;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    sVar5 = strlen(s);
    __n = 0xff;
    if (sVar5 < 0xff) {
      __n = sVar5;
    }
    peVar8 = lev->lev_engr;
    peVar6 = peVar8;
    if (peVar8 == (engr *)0x0) {
      peVar8 = (engr *)0x0;
    }
    else {
      do {
        if ((peVar6->engr_x == (char)x) && (peVar6->engr_y == (char)y)) {
          del_engr(lev,peVar6);
          peVar8 = lev->lev_engr;
          break;
        }
        ppeVar2 = &peVar6->nxt_engr;
        peVar6 = *ppeVar2;
      } while (*ppeVar2 != (engr *)0x0);
    }
    peVar6 = (engr *)calloc(1,__n + 0x29);
    peVar6->nxt_engr = peVar8;
    lev->lev_engr = peVar6;
    peVar6->engr_x = (char)x;
    peVar6->engr_y = (char)y;
    peVar6->engr_txt = (char *)(peVar6 + 1);
    strncpy((char *)(peVar6 + 1),s,__n);
    *(undefined1 *)((long)&peVar6[1].nxt_engr + __n) = 0;
    if (*(char *)&peVar6[1].nxt_engr == ' ') {
      pcVar7 = (char *)((long)&peVar6[1].nxt_engr + 1);
      do {
        peVar6->engr_txt = pcVar7;
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar1 == ' ');
    }
    if ((in_mklev == '\0') && (iVar3 = strcmp(s,"Elbereth"), iVar3 == 0)) {
      exercise(2,'\x01');
    }
    peVar6->engr_time = e_time;
    if (e_type < '\x01') {
      uVar4 = mt_random();
      e_type = (char)uVar4 + (char)(uVar4 / 5) * -5 + '\x01';
    }
    peVar6->engr_type = e_type;
    peVar6->engr_lth = (int)__n + 1;
  }
  return;
}

Assistant:

void make_engr_at(struct level *lev, int x, int y,
		  const char *s, long e_time, xchar e_type)
{
	struct engr *ep;
	size_t engr_len;

	if (!s || !*s)
	    return;

	engr_len = strlen(s);
	if (engr_len > BUFSZ - 1)
	    engr_len = BUFSZ - 1;

	if ((ep = engr_at(lev, x,y)) != 0)
	    del_engr(lev, ep);
	ep = newengr(engr_len + 1);
	memset(ep, 0, sizeof(struct engr) + engr_len + 1);
	ep->nxt_engr = lev->lev_engr;
	lev->lev_engr = ep;
	ep->engr_x = x;
	ep->engr_y = y;
	ep->engr_txt = (char *)(ep + 1);
	strncpy(ep->engr_txt, s, engr_len);
	ep->engr_txt[engr_len] = '\0';
	while (ep->engr_txt[0] == ' ')
	    ep->engr_txt++;
	/* engraving Elbereth shows wisdom */
	if (!in_mklev && !strcmp(s, "Elbereth")) exercise(A_WIS, TRUE);
	ep->engr_time = e_time;
	ep->engr_type = e_type > 0 ? e_type : rnd(N_ENGRAVE-1);
	ep->engr_lth = engr_len + 1;
}